

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

size_t Assimp::OpenGEX::countDataArrayListItems(DataArrayList *vaList)

{
  size_t sVar1;
  DataArrayList *pDVar2;
  DataArrayList *next;
  
  sVar1 = 0;
  for (pDVar2 = vaList; pDVar2 != (DataArrayList *)0x0; pDVar2 = pDVar2->m_next) {
    sVar1 = (sVar1 + 1) - (ulong)(vaList->m_dataList == (Value *)0x0);
  }
  return sVar1;
}

Assistant:

static size_t countDataArrayListItems( DataArrayList *vaList ) {
    size_t numItems( 0 );
    if( nullptr == vaList ) {
        return numItems;
    }

    DataArrayList *next( vaList );
    while( nullptr != next ) {
        if( nullptr != vaList->m_dataList ) {
            numItems++;
        }
        next = next->m_next;
    }

    return numItems;
}